

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

ExtPubkey * __thiscall
cfd::core::DescriptorKeyInfo::GetExtPubkey
          (ExtPubkey *__return_storage_ptr__,DescriptorKeyInfo *this)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_);
  uVar1 = (this->extpubkey_).fingerprint_;
  uVar2 = (this->extpubkey_).depth_;
  uVar3 = *(undefined3 *)&(this->extpubkey_).field_0x21;
  uVar4 = (this->extpubkey_).child_num_;
  __return_storage_ptr__->version_ = (this->extpubkey_).version_;
  __return_storage_ptr__->fingerprint_ = uVar1;
  __return_storage_ptr__->depth_ = uVar2;
  *(undefined3 *)&__return_storage_ptr__->field_0x21 = uVar3;
  __return_storage_ptr__->child_num_ = uVar4;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(__return_storage_ptr__->chaincode_).data_,&(this->extpubkey_).chaincode_.data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &__return_storage_ptr__->pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(__return_storage_ptr__->tweak_sum_).data_,&(this->extpubkey_).tweak_sum_.data_);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey DescriptorKeyInfo::GetExtPubkey() const { return extpubkey_; }